

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void srcarg_matrix_replicate(Context *ctx,int idx,int rows)

{
  VariableList *pVVar1;
  int iVar2;
  SourceMod SVar3;
  RegisterType RVar4;
  int iVar5;
  RegisterType RVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  SourceArgInfo *pSVar15;
  
  pSVar15 = ctx->source_args + 2;
  iVar14 = 1;
  if (idx < 2) {
    idx = 1;
  }
  for (; idx != iVar14; iVar14 = iVar14 + 1) {
    iVar13 = ctx->source_args[1].regnum;
    iVar2 = ctx->source_args[1].swizzle;
    iVar9 = ctx->source_args[1].swizzle_x;
    iVar10 = ctx->source_args[1].swizzle_y;
    iVar11 = ctx->source_args[1].swizzle_z;
    iVar12 = ctx->source_args[1].swizzle_w;
    SVar3 = ctx->source_args[1].src_mod;
    RVar4 = ctx->source_args[1].regtype;
    iVar5 = ctx->source_args[1].relative;
    RVar6 = ctx->source_args[1].relative_regtype;
    iVar7 = ctx->source_args[1].relative_regnum;
    iVar8 = ctx->source_args[1].relative_component;
    pVVar1 = ctx->source_args[1].relative_array;
    pSVar15->token = ctx->source_args[1].token;
    pSVar15->regnum = iVar13;
    pSVar15->swizzle = iVar2;
    pSVar15->src_mod = SVar3;
    pSVar15->regtype = RVar4;
    pSVar15->relative = iVar5;
    pSVar15->relative_regtype = RVar6;
    pSVar15->relative_regnum = iVar7;
    pSVar15->relative_component = iVar8;
    pSVar15->relative_array = pVVar1;
    pSVar15->swizzle_x = iVar9;
    pSVar15->swizzle_y = iVar10;
    pSVar15->swizzle_z = iVar11;
    pSVar15->swizzle_w = iVar12;
    iVar13 = pSVar15->regnum + iVar14;
    pSVar15->regnum = iVar13;
    set_used_register(ctx,pSVar15->regtype,iVar13,0);
    pSVar15 = pSVar15 + 1;
  }
  return;
}

Assistant:

static void srcarg_matrix_replicate(Context *ctx, const int idx,
                                       const int rows)
{
    int i;
    SourceArgInfo *src = &ctx->source_args[idx];
    SourceArgInfo *dst = &ctx->source_args[idx+1];
    for (i = 0; i < (rows-1); i++, dst++)
    {
        memcpy(dst, src, sizeof (SourceArgInfo));
        dst->regnum += (i + 1);
        set_used_register(ctx, dst->regtype, dst->regnum, 0);
    } // for
}